

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

double __thiscall p2t::Sweep::HoleAngle(Sweep *this,Node *node)

{
  Point *pPVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  pPVar1 = node->next->point;
  dVar3 = node->point->x;
  dVar5 = node->point->y;
  dVar2 = pPVar1->x - dVar3;
  dVar4 = pPVar1->y - dVar5;
  pPVar1 = node->prev->point;
  dVar3 = pPVar1->x - dVar3;
  dVar5 = pPVar1->y - dVar5;
  dVar3 = atan2(dVar2 * dVar5 - dVar3 * dVar4,dVar3 * dVar2 + dVar5 * dVar4);
  return dVar3;
}

Assistant:

double Sweep::HoleAngle(const Node& node) const
{
  /* Complex plane
   * ab = cosA +i*sinA
   * ab = (ax + ay*i)(bx + by*i) = (ax*bx + ay*by) + i(ax*by-ay*bx)
   * atan2(y,x) computes the principal value of the argument function
   * applied to the complex number x+iy
   * Where x = ax*bx + ay*by
   *       y = ax*by - ay*bx
   */
  const double ax = node.next->point->x - node.point->x;
  const double ay = node.next->point->y - node.point->y;
  const double bx = node.prev->point->x - node.point->x;
  const double by = node.prev->point->y - node.point->y;
  return atan2(ax * by - ay * bx, ax * bx + ay * by);
}